

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O1

int parseconfig(char *filename,GlobalConfig *global)

{
  byte bVar1;
  int iVar2;
  ParameterError res;
  char *pcVar3;
  size_t sVar4;
  FILE *__stream;
  size_t sVar5;
  byte *__s;
  char *pcVar6;
  byte *pbVar7;
  OperationConfig *pOVar8;
  byte *pbVar9;
  byte bVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  _Bool usedarg;
  char filebuffer [512];
  char buf [4096];
  _Bool local_125a;
  byte local_1259;
  byte *local_1258;
  OperationConfig *local_1250;
  char *local_1248;
  GlobalConfig *local_1240;
  char local_1238 [512];
  char local_1038 [4104];
  
  local_125a = false;
  pOVar8 = global->first;
  if ((filename == (char *)0x0) || (*filename == '\0')) {
    pcVar3 = homedir();
    if (pcVar3 == (char *)0x0) {
      filename = ".curlrc";
    }
    else {
      sVar4 = strlen(pcVar3);
      if (sVar4 < 0x1f9) {
        filename = local_1238;
        curl_msnprintf(filename,0x200,"%s%s%s",pcVar3,"/",".curlrc");
      }
      else {
        filename = ".curlrc";
      }
      free(pcVar3);
    }
  }
  iVar2 = strcmp(filename,"-");
  __stream = _stdin;
  if (iVar2 != 0) {
    __stream = fopen64(filename,"r");
  }
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  uVar11 = 0;
  local_1250 = pOVar8;
  local_1248 = filename;
  local_1240 = global;
  do {
    pcVar3 = fgets(local_1038,0x1000,__stream);
    __s = (byte *)0x0;
    pbVar13 = __s;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      do {
        if (pbVar13 == (byte *)0x0) {
          __s = (byte *)strdup(local_1038);
          if (__s == (byte *)0x0) goto LAB_00118b14;
        }
        else {
          sVar4 = strlen((char *)pbVar13);
          sVar5 = strlen(local_1038);
          __s = (byte *)realloc(pbVar13,sVar4 + sVar5 + 1);
          if (__s == (byte *)0x0) {
            free(pbVar13);
LAB_00118b14:
            __s = (byte *)0x0;
            goto LAB_00118b16;
          }
          strcpy((char *)(__s + sVar4),local_1038);
        }
        pcVar3 = strchr((char *)__s,10);
      } while ((pcVar3 == (char *)0x0) &&
              (pcVar6 = fgets(local_1038,0x1000,__stream), pbVar13 = __s, pcVar6 != (char *)0x0));
    }
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
LAB_00118b16:
    if (__s == (byte *)0x0) {
      iVar2 = 0;
LAB_00118e9c:
      if (__stream == _stdin) {
        return iVar2;
      }
      fclose(__stream);
      return iVar2;
    }
    bVar10 = *__s;
    pbVar13 = __s;
    while ((bVar10 != 0 && (iVar2 = Curl_isspace((uint)bVar10), iVar2 != 0))) {
      bVar10 = pbVar13[1];
      pbVar13 = pbVar13 + 1;
    }
    uVar11 = uVar11 + 1;
    bVar10 = *pbVar13;
    if ((0x2f < (ulong)bVar10) || ((0x840800002401U >> ((ulong)bVar10 & 0x3f) & 1) == 0)) {
      bVar1 = *pbVar13;
      pbVar9 = pbVar13;
      pbVar7 = local_1258;
      while (((local_1258 = pbVar9, pbVar9 = local_1258, bVar1 != 0 &&
              (iVar2 = Curl_isspace((uint)bVar1), pbVar9 = local_1258, pbVar7 = local_1258,
              iVar2 == 0)) && ((bVar10 == 0x2d || ((*local_1258 != 0x3a && (*local_1258 != 0x3d)))))
             )) {
        bVar1 = local_1258[1];
        pbVar9 = local_1258 + 1;
      }
      local_1258 = pbVar7;
      if (*pbVar9 != 0) {
        *pbVar9 = 0;
        pbVar9 = pbVar9 + 1;
      }
      bVar1 = *pbVar9;
      while ((bVar1 != 0 &&
             ((local_1258 = pbVar9, iVar2 = Curl_isspace((uint)bVar1), iVar2 != 0 ||
              ((pbVar9 = local_1258, bVar10 != 0x2d &&
               ((*local_1258 == 0x3d || (*local_1258 == 0x3a))))))))) {
        bVar1 = local_1258[1];
        pbVar9 = local_1258 + 1;
      }
      local_1259 = *pbVar9;
      if (local_1259 == 0x22) {
        sVar4 = strlen((char *)(pbVar9 + 1));
        pbVar7 = (byte *)malloc(sVar4 + 1);
        pbVar12 = pbVar7;
        pbVar9 = pbVar9 + 1;
        if (pbVar7 == (byte *)0x0) {
          free(__s);
          iVar2 = 1;
          goto LAB_00118e9c;
        }
LAB_00118c2c:
        while( true ) {
          pbVar14 = pbVar9;
          bVar10 = *pbVar14;
          if (bVar10 == 0x5c) {
            bVar10 = pbVar14[1];
            switch(bVar10) {
            case 0x6e:
              bVar10 = 10;
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
            case 0x75:
              break;
            case 0x72:
              bVar10 = 0xd;
              break;
            case 0x74:
              bVar10 = 9;
              break;
            case 0x76:
              bVar10 = 0xb;
              break;
            default:
              goto switchD_00118c6c_default;
            }
            goto switchD_00118c6c_caseD_6f;
          }
          if ((bVar10 == 0) || (bVar10 == 0x22)) break;
          *pbVar12 = bVar10;
          pbVar12 = pbVar12 + 1;
          pbVar9 = pbVar14 + 1;
        }
        *pbVar12 = 0;
      }
      else {
        bVar10 = *pbVar9;
        local_1258 = pbVar9;
        while ((bVar10 != 0 && (iVar2 = Curl_isspace((uint)bVar10), iVar2 == 0))) {
          bVar10 = pbVar9[1];
          pbVar9 = pbVar9 + 1;
        }
        if (*pbVar9 != 0) {
          *pbVar9 = 0;
          do {
            pbVar9 = pbVar9 + 1;
            if (*pbVar9 == 0) break;
            iVar2 = Curl_isspace((uint)*pbVar9);
          } while (iVar2 != 0);
          if ((0x23 < (ulong)*pbVar9) || ((0x800002401U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0)) {
            warnf(local_1250->global,
                  "%s:%d: warning: \'%s\' uses unquoted white space in the line that may cause side-effects!\n"
                  ,local_1248,(ulong)uVar11,pbVar13);
          }
        }
        pbVar7 = (byte *)0x0;
        if (*local_1258 != 0) {
          pbVar7 = local_1258;
        }
      }
      local_1258 = pbVar7;
      res = getparameter((char *)pbVar13,(char *)pbVar7,&local_125a,local_1240,local_1250);
      if ((local_1258 != (byte *)0x0) && (res == PARAM_OK)) {
        if (*local_1258 == 0) {
          res = PARAM_OK;
        }
        else {
          res = (local_125a ^ 1) * 9;
        }
      }
      if (res == PARAM_NEXT_OPERATION) {
        res = PARAM_NEXT_OPERATION;
        if ((local_1250->url_list != (getout *)0x0) && (local_1250->url_list->url != (char *)0x0)) {
          pOVar8 = (OperationConfig *)malloc(0x480);
          local_1250->next = pOVar8;
          if (pOVar8 == (OperationConfig *)0x0) {
            res = PARAM_NO_MEM;
          }
          else {
            config_init(pOVar8);
            pOVar8 = local_1250->next;
            pOVar8->easy = local_1240->easy;
            pOVar8->global = local_1240;
            local_1240->last = pOVar8;
            pOVar8->prev = local_1250;
            local_1250 = pOVar8;
          }
        }
      }
      if ((res != PARAM_OK) && (res != PARAM_NEXT_OPERATION)) {
        iVar2 = strcmp(local_1248,"-");
        if (iVar2 == 0) {
          local_1248 = "<stdin>";
        }
        if (res - PARAM_GOT_EXTRA_PARAMETER < 0xfffffffc) {
          pcVar3 = param2text(res);
          warnf(local_1250->global,"%s:%d: warning: \'%s\' %s\n",local_1248,(ulong)uVar11,pbVar13,
                pcVar3);
        }
      }
      if (local_1259 == 0x22) {
        free(local_1258);
      }
    }
    free(__s);
  } while( true );
switchD_00118c6c_default:
  pbVar9 = pbVar14 + 1;
  if (bVar10 != 0) {
switchD_00118c6c_caseD_6f:
    *pbVar12 = bVar10;
    pbVar12 = pbVar12 + 1;
    pbVar9 = pbVar14 + 2;
  }
  goto LAB_00118c2c;
}

Assistant:

int parseconfig(const char *filename, struct GlobalConfig *global)
{
  int res;
  FILE *file;
  char filebuffer[512];
  bool usedarg = FALSE;
  char *home;
  int rc = 0;
  struct OperationConfig *operation = global->first;

  if(!filename || !*filename) {
    /* NULL or no file name attempts to load .curlrc from the homedir! */

#ifndef __AMIGA__
    filename = CURLRC;   /* sensible default */
    home = homedir();    /* portable homedir finder */
    if(home) {
      if(strlen(home) < (sizeof(filebuffer) - strlen(CURLRC))) {
        snprintf(filebuffer, sizeof(filebuffer),
                 "%s%s%s", home, DIR_CHAR, CURLRC);

#ifdef WIN32
        /* Check if the file exists - if not, try CURLRC in the same
         * directory as our executable
         */
        file = fopen(filebuffer, FOPEN_READTEXT);
        if(file != NULL) {
          fclose(file);
          filename = filebuffer;
        }
        else {
          /* Get the filename of our executable. GetModuleFileName is
           * already declared via inclusions done in setup header file.
           * We assume that we are using the ASCII version here.
           */
          int n = GetModuleFileNameA(0, filebuffer, sizeof(filebuffer));
          if(n > 0 && n < (int)sizeof(filebuffer)) {
            /* We got a valid filename - get the directory part */
            char *lastdirchar = strrchr(filebuffer, '\\');
            if(lastdirchar) {
              size_t remaining;
              *lastdirchar = 0;
              /* If we have enough space, build the RC filename */
              remaining = sizeof(filebuffer) - strlen(filebuffer);
              if(strlen(CURLRC) < remaining - 1) {
                snprintf(lastdirchar, remaining,
                         "%s%s", DIR_CHAR, CURLRC);
                /* Don't bother checking if it exists - we do
                 * that later
                 */
                filename = filebuffer;
              }
            }
          }
        }
#else /* WIN32 */
        filename = filebuffer;
#endif /* WIN32 */
      }
      Curl_safefree(home); /* we've used it, now free it */
    }

# else /* __AMIGA__ */
    /* On AmigaOS all the config files are into env:
     */
    filename = "ENV:" CURLRC;

#endif
  }

  if(strcmp(filename, "-"))
    file = fopen(filename, FOPEN_READTEXT);
  else
    file = stdin;

  if(file) {
    char *line;
    char *aline;
    char *option;
    char *param;
    int lineno = 0;
    bool alloced_param;
    bool dashed_option;

    while(NULL != (aline = my_get_line(file))) {
      lineno++;
      line = aline;
      alloced_param = FALSE;

      /* line with # in the first non-blank column is a comment! */
      while(*line && ISSPACE(*line))
        line++;

      switch(*line) {
      case '#':
      case '/':
      case '\r':
      case '\n':
      case '*':
      case '\0':
        Curl_safefree(aline);
        continue;
      }

      /* the option keywords starts here */
      option = line;

      /* the option starts with a dash? */
      dashed_option = option[0]=='-'?TRUE:FALSE;

      while(*line && !ISSPACE(*line) && !ISSEP(*line, dashed_option))
        line++;
      /* ... and has ended here */

      if(*line)
        *line++ = '\0'; /* zero terminate, we have a local copy of the data */

#ifdef DEBUG_CONFIG
      fprintf(stderr, "GOT: %s\n", option);
#endif

      /* pass spaces and separator(s) */
      while(*line && (ISSPACE(*line) || ISSEP(*line, dashed_option)))
        line++;

      /* the parameter starts here (unless quoted) */
      if(*line == '\"') {
        /* quoted parameter, do the quote dance */
        line++;
        param = malloc(strlen(line) + 1); /* parameter */
        if(!param) {
          /* out of memory */
          Curl_safefree(aline);
          rc = 1;
          break;
        }
        alloced_param = TRUE;
        (void)unslashquote(line, param);
      }
      else {
        param = line; /* parameter starts here */
        while(*line && !ISSPACE(*line))
          line++;

        if(*line) {
          *line = '\0'; /* zero terminate */

          /* to detect mistakes better, see if there's data following */
          line++;
          /* pass all spaces */
          while(*line && ISSPACE(*line))
            line++;

          switch(*line) {
          case '\0':
          case '\r':
          case '\n':
          case '#': /* comment */
            break;
          default:
            warnf(operation->global, "%s:%d: warning: '%s' uses unquoted "
                  "white space in the line that may cause side-effects!\n",
                  filename, lineno, option);
          }
        }
        if(!*param)
          /* do this so getparameter can check for required parameters.
             Otherwise it always thinks there's a parameter. */
          param = NULL;
      }

#ifdef DEBUG_CONFIG
      fprintf(stderr, "PARAM: \"%s\"\n",(param ? param : "(null)"));
#endif
      res = getparameter(option, param, &usedarg, global, operation);

      if(!res && param && *param && !usedarg)
        /* we passed in a parameter that wasn't used! */
        res = PARAM_GOT_EXTRA_PARAMETER;

      if(res == PARAM_NEXT_OPERATION) {
        if(operation->url_list && operation->url_list->url) {
          /* Allocate the next config */
          operation->next = malloc(sizeof(struct OperationConfig));
          if(operation->next) {
            /* Initialise the newly created config */
            config_init(operation->next);

            /* Copy the easy handle */
            operation->next->easy = global->easy;

            /* Set the global config pointer */
            operation->next->global = global;

            /* Update the last operation pointer */
            global->last = operation->next;

            /* Move onto the new config */
            operation->next->prev = operation;
            operation = operation->next;
          }
          else
            res = PARAM_NO_MEM;
        }
      }

      if(res != PARAM_OK && res != PARAM_NEXT_OPERATION) {
        /* the help request isn't really an error */
        if(!strcmp(filename, "-")) {
          filename = "<stdin>";
        }
        if(res != PARAM_HELP_REQUESTED &&
           res != PARAM_MANUAL_REQUESTED &&
           res != PARAM_VERSION_INFO_REQUESTED &&
           res != PARAM_ENGINES_REQUESTED) {
          const char *reason = param2text(res);
          warnf(operation->global, "%s:%d: warning: '%s' %s\n",
                filename, lineno, option, reason);
        }
      }

      if(alloced_param)
        Curl_safefree(param);

      Curl_safefree(aline);
    }
    if(file != stdin)
      fclose(file);
  }
  else
    rc = 1; /* couldn't open the file */

  return rc;
}